

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O3

void ihevc_inter_pred_luma_vert_w16inp_w16out
               (WORD16 *pi2_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  long lVar1;
  short *psVar2;
  uint uVar3;
  short *psVar4;
  int iVar5;
  short *psVar6;
  ulong uVar7;
  long lVar8;
  
  if (0 < ht) {
    lVar1 = (long)src_strd;
    psVar4 = pi2_src + lVar1 * -3;
    iVar5 = 0;
    do {
      if (0 < wd) {
        uVar7 = 0;
        psVar2 = psVar4;
        do {
          lVar8 = 0;
          uVar3 = 0;
          psVar6 = psVar2;
          do {
            uVar3 = uVar3 + (int)*psVar6 * (int)pi1_coeff[lVar8];
            lVar8 = lVar8 + 1;
            psVar6 = psVar6 + lVar1;
          } while (lVar8 != 8);
          pi2_dst[uVar7] = (short)(uVar3 >> 6) + -0x2000;
          uVar7 = uVar7 + 1;
          psVar2 = psVar2 + 1;
        } while (uVar7 != (uint)wd);
      }
      pi2_dst = pi2_dst + dst_strd;
      iVar5 = iVar5 + 1;
      psVar4 = psVar4 + lVar1;
    } while (iVar5 != ht);
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_vert_w16inp_w16out(WORD16 *pi2_src,
                                              WORD16 *pi2_dst,
                                              WORD32 src_strd,
                                              WORD32 dst_strd,
                                              WORD8 *pi1_coeff,
                                              WORD32 ht,
                                              WORD32 wd)
{
    WORD32 row, col, i;
    WORD32 i4_tmp;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < wd; col++)
        {
            i4_tmp = 0;
            for(i = 0; i < NTAPS_LUMA; i++)
                i4_tmp += pi1_coeff[i] * pi2_src[col + (i - 3) * src_strd];

            i4_tmp = (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) - OFFSET14;

            pi2_dst[col] = i4_tmp;
        }

        pi2_src += src_strd;
        pi2_dst += dst_strd;
    }

}